

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O0

int lj_cf_package_seeall(lua_State *L)

{
  int iVar1;
  undefined8 in_RDI;
  int in_stack_0000000c;
  int in_stack_00000010;
  int in_stack_00000014;
  undefined4 in_stack_00000018;
  int in_stack_0000001c;
  lua_State *in_stack_00000020;
  int in_stack_0000002c;
  lua_State *in_stack_00000030;
  int in_stack_0000003c;
  lua_State *in_stack_00000040;
  
  luaL_checktype(L,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  iVar1 = lua_getmetatable(in_stack_00000020,in_stack_0000001c);
  if (iVar1 == 0) {
    lua_createtable((lua_State *)CONCAT44(in_stack_0000001c,in_stack_00000018),in_stack_00000014,
                    in_stack_00000010);
    lua_pushvalue((lua_State *)CONCAT44(in_stack_00000014,in_stack_00000010),in_stack_0000000c);
    lua_setmetatable(in_stack_00000030,in_stack_0000002c);
  }
  lua_pushvalue((lua_State *)CONCAT44(in_stack_00000014,in_stack_00000010),in_stack_0000000c);
  lua_setfield(in_stack_00000040,in_stack_0000003c,(char *)in_stack_00000030);
  return 0;
}

Assistant:

static int lj_cf_package_seeall(lua_State *L)
{
  luaL_checktype(L, 1, LUA_TTABLE);
  if (!lua_getmetatable(L, 1)) {
    lua_createtable(L, 0, 1); /* create new metatable */
    lua_pushvalue(L, -1);
    lua_setmetatable(L, 1);
  }
  lua_pushvalue(L, LUA_GLOBALSINDEX);
  lua_setfield(L, -2, "__index");  /* mt.__index = _G */
  return 0;
}